

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_mnist.cpp
# Opt level: O0

int main(void)

{
  byte bVar1;
  Dataset *data;
  size_t sVar2;
  MakeNet *pMVar3;
  PlainTextNetworkWriter *this;
  ostream *poVar4;
  __off_t __length;
  allocator local_559;
  string local_558 [32];
  PlainTextNetworkWriter local_538;
  ostream local_530 [8];
  ofstream nnfile;
  anon_class_24_3_9ee64dc5 local_330;
  undefined1 local_318 [40];
  anon_class_24_3_16305adc local_2f0;
  undefined1 local_2d8 [40];
  AdaDelta local_2b0;
  undefined1 local_290 [8];
  IntClassifier metrics;
  MakeNet local_258;
  undefined1 local_210 [8];
  Net net;
  unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
  rng;
  undefined1 local_1b8 [8];
  OneHotEncoder onehot;
  undefined1 local_138 [8];
  LabeledDataset mnistMiniTest;
  undefined1 local_d0 [8];
  LabeledDataset mnistTest;
  string local_78 [32];
  undefined1 local_58 [8];
  LabeledDataset mnist;
  
  mnist.outputs.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::__cxx11::string::string(local_78,(string *)LABELS_FILE_abi_cxx11_);
  readMNIST((LabeledDataset *)local_58,(string *)IMAGES_FILE_abi_cxx11_,(string *)local_78);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::string
            ((string *)
             &mnistMiniTest.outputs.
              super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (string *)LABELS_TEST_FILE_abi_cxx11_);
  readMNIST((LabeledDataset *)local_d0,(string *)IMAGES_TEST_FILE_abi_cxx11_,
            (string *)
            &mnistMiniTest.outputs.
             super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &mnistMiniTest.outputs.
              super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::string((string *)&onehot.nExtraCols,(string *)LABELS_TEST_FILE_abi_cxx11_);
  readMNIST((LabeledDataset *)local_138,(string *)IMAGES_TEST_FILE_abi_cxx11_,
            (string *)&onehot.nExtraCols);
  std::__cxx11::string::~string((string *)&onehot.nExtraCols);
  data = notch::core::LabeledDataset::getLabels((LabeledDataset *)local_58);
  rng._M_t.
  super___uniq_ptr_impl<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
  .
  super__Head_base<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>,_true,_true>
        )(__uniq_ptr_impl<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
          )0x0;
  notch::core::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&rng);
  notch::pre::OneHotEncoder::OneHotEncoder
            ((OneHotEncoder *)local_1b8,data,(vector<int,_std::allocator<int>_> *)&rng);
  notch::core::std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&rng);
  notch::core::LabeledDataset::applyToLabels
            ((LabeledDataset *)local_58,(ADatasetTransformer *)local_1b8);
  notch::core::LabeledDataset::applyToLabels
            ((LabeledDataset *)local_d0,(ADatasetTransformer *)local_1b8);
  notch::core::LabeledDataset::applyToLabels
            ((LabeledDataset *)local_138,(ADatasetTransformer *)local_1b8);
  notch::core::Init::newRNG();
  notch::core::LabeledDataset::shuffle
            ((LabeledDataset *)local_138,
             (unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
              *)&net.lossLayer.
                 super___shared_ptr<notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  notch::core::LabeledDataset::truncate((LabeledDataset *)local_138,(char *)0x3e8,__length);
  sVar2 = notch::core::LabeledDataset::inputDim((LabeledDataset *)local_58);
  notch::core::MakeNet::MakeNet(&local_258,sVar2);
  pMVar3 = notch::core::MakeNet::addFC(&local_258,300,(Activation *)notch::core::scaledTanh);
  pMVar3 = notch::core::MakeNet::addFC(pMVar3,100,(Activation *)notch::core::leakyReLU);
  sVar2 = notch::core::LabeledDataset::outputDim((LabeledDataset *)local_58);
  pMVar3 = notch::core::MakeNet::addFC(pMVar3,sVar2,(Activation *)notch::core::scaledTanh);
  pMVar3 = notch::core::MakeNet::addSoftmax(pMVar3);
  std::
  function<void(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>,std::default_delete<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>>&,std::valarray<float>&,int,int)>
  ::
  function<void(&)(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>,std::default_delete<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>>&,std::valarray<float>&,int,int),void>
            ((function<void(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>,std::default_delete<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>>&,std::valarray<float>&,int,int)>
              *)&metrics.net,notch::core::Init::normalXavier);
  notch::core::MakeNet::init((MakeNet *)local_210,(EVP_PKEY_CTX *)pMVar3);
  notch::core::std::
  function<void_(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int)>
  ::~function((function<void_(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int)>
               *)&metrics.net);
  notch::core::MakeNet::~MakeNet(&local_258);
  IntClassifier::IntClassifier
            ((IntClassifier *)local_290,(Net *)local_210,(OneHotEncoder *)local_1b8);
  notch::core::AdaDelta::AdaDelta(&local_2b0,0.95,1e-06);
  notch::core::Net::setLearningPolicy((Net *)local_210,&local_2b0.super_ALearningPolicy);
  local_2d8._0_4_ = 1;
  local_2f0.net = (Net *)local_210;
  local_2f0.mnistTest = (LabeledDataset *)local_d0;
  local_2f0.metrics = (IntClassifier *)local_290;
  std::function<bool(int)>::function<main::__0,void>
            ((function<bool(int)> *)(local_2d8 + 8),&local_2f0);
  local_318._0_4_ = 1000;
  local_330.net = (Net *)local_210;
  local_330.mnistMiniTest = (LabeledDataset *)local_138;
  local_330.metrics = (IntClassifier *)local_290;
  std::function<bool(int)>::function<main::__1,void>
            ((function<bool(int)> *)(local_318 + 8),&local_330);
  notch::core::SGD::train
            ((Net *)local_210,(LabeledDataset *)local_58,3,(EpochCallback *)local_2d8,
             (IterationCallback *)local_318);
  notch::core::IterationCallback::~IterationCallback((IterationCallback *)local_318);
  notch::core::EpochCallback::~EpochCallback((EpochCallback *)local_2d8);
  std::ofstream::ofstream(local_530,(string *)SAVE_NETWORK_SNAPSHOT_abi_cxx11_,_S_out);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) != 0) {
    notch::io::PlainTextNetworkWriter::PlainTextNetworkWriter(&local_538,local_530);
    this = notch::io::PlainTextNetworkWriter::operator<<(&local_538,(Net *)local_210);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_558,"\n",&local_559);
    notch::io::PlainTextNetworkWriter::operator<<(this,(string *)local_558);
    std::__cxx11::string::~string(local_558);
    std::allocator<char>::~allocator((allocator<char> *)&local_559);
    poVar4 = std::operator<<((ostream *)&std::cout,"wrote ");
    poVar4 = std::operator<<(poVar4,(string *)SAVE_NETWORK_SNAPSHOT_abi_cxx11_);
    std::operator<<(poVar4,"\n");
  }
  std::ofstream::~ofstream(local_530);
  notch::core::Net::~Net((Net *)local_210);
  notch::core::std::
  unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
  ::~unique_ptr((unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                 *)&net.lossLayer.
                    super___shared_ptr<notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
  notch::pre::OneHotEncoder::~OneHotEncoder((OneHotEncoder *)local_1b8);
  notch::core::LabeledDataset::~LabeledDataset((LabeledDataset *)local_138);
  notch::core::LabeledDataset::~LabeledDataset((LabeledDataset *)local_d0);
  notch::core::LabeledDataset::~LabeledDataset((LabeledDataset *)local_58);
  return mnist.outputs.
         super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

int main() {
    LabeledDataset mnist = readMNIST(IMAGES_FILE, LABELS_FILE);
    LabeledDataset mnistTest = readMNIST(IMAGES_TEST_FILE, LABELS_TEST_FILE);
    LabeledDataset mnistMiniTest = readMNIST(IMAGES_TEST_FILE, LABELS_TEST_FILE);

    OneHotEncoder onehot(mnist.getLabels());
    mnist.applyToLabels(onehot);
    mnistTest.applyToLabels(onehot);
    mnistMiniTest.applyToLabels(onehot);

    // test on a small dataset while running
    unique_ptr<RNG> rng = Init::newRNG();
    mnistMiniTest.shuffle(rng);
    mnistMiniTest.truncate(1000);

    Net net = MakeNet(mnist.inputDim())
        .addFC(300, scaledTanh)
        .addFC(100, leakyReLU)
        .addFC(mnist.outputDim(), scaledTanh)
        .addSoftmax()
        .init();

    IntClassifier metrics(net, onehot);
    net.setLearningPolicy(AdaDelta());
    SGD::train(net, mnist, 3 /* epochs */,
               EpochCallback { 1, [&](int i) {
                   cout << "epoch " << i << ": ";
                   printStats(net, mnistTest, metrics);
                   return false;
               }},
               IterationCallback { 1000, [&](int i) {
                   cout << "sample " << i << ": ";
                   printStats(net, mnistMiniTest, metrics);
                   return false;
               }});

    ofstream nnfile(SAVE_NETWORK_SNAPSHOT);
    if (nnfile.is_open()) {
        PlainTextNetworkWriter(nnfile) << net << "\n";
        cout << "wrote " << SAVE_NETWORK_SNAPSHOT << "\n";
    }
}